

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

AggregateFunction *
duckdb::GetTypedModeFunction<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>
          (LogicalType *type)

{
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *func;
  AggregateFunction *pAVar1;
  LogicalType local_48 [24];
  LogicalType local_30 [31];
  undefined1 local_11;
  AggregateFunction *input_type;
  
  local_11 = 0;
  pAVar1 = in_RDI;
  input_type = in_RDI;
  duckdb::LogicalType::LogicalType(local_30,in_RSI);
  duckdb::LogicalType::LogicalType(local_48,in_RSI);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>,(duckdb::AggregateDestructorType)1>
            ((LogicalType *)input_type,in_RSI);
  duckdb::LogicalType::~LogicalType(local_48);
  duckdb::LogicalType::~LogicalType(local_30);
  in_RDI->window =
       ModeFunction<duckdb::ModeStandard<duckdb::hugeint_t>>::
       Window<duckdb::ModeState<duckdb::hugeint_t,duckdb::ModeStandard<duckdb::hugeint_t>>,duckdb::hugeint_t,duckdb::hugeint_t>
  ;
  return pAVar1;
}

Assistant:

AggregateFunction GetTypedModeFunction(const LogicalType &type) {
	using STATE = ModeState<INPUT_TYPE, TYPE_OP>;
	using OP = ModeFunction<TYPE_OP>;
	auto func =
	    AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, INPUT_TYPE, OP, AggregateDestructorType::LEGACY>(
	        type, type);
	func.window = OP::template Window<STATE, INPUT_TYPE, INPUT_TYPE>;
	return func;
}